

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_file_contents(char *filename,wchar_t line,void *buff,wchar_t s,char *fn)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  void *__ptr;
  size_t sVar3;
  int in_ECX;
  void *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  char *in_R8;
  wchar_t n;
  FILE *f;
  char *contents;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  __stream = fopen(in_R8,"rb");
  if (__stream == (FILE *)0x0) {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"File should exist: %s",in_R8);
    failure_finish((void *)0x106b7c);
    local_4 = L'\0';
  }
  else {
    __ptr = malloc((long)(in_ECX << 1));
    sVar3 = fread(__ptr,1,(long)(in_ECX << 1),__stream);
    iVar1 = (int)sVar3;
    fclose(__stream);
    if ((iVar1 == in_ECX) && (iVar2 = memcmp(in_RDX,__ptr,(long)in_ECX), iVar2 == 0)) {
      free(__ptr);
      local_4 = L'\x01';
    }
    else {
      failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"File contents don\'t match");
      logprintf("  file=\"%s\"\n",in_R8);
      if (iVar1 < 1) {
        logprintf("  File empty, contents should be:\n");
        hexdump((char *)__stream,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
                in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      else {
        hexdump((char *)__stream,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),(size_t)in_RDX,
                (size_t)__ptr);
      }
      failure_finish((void *)0x106cd5);
      free(__ptr);
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

int
assertion_file_contents(const char *filename, int line, const void *buff, int s, const char *fn)
{
	char *contents;
	FILE *f;
	int n;

	assertion_count(filename, line);

	f = fopen(fn, "rb");
	if (f == NULL) {
		failure_start(filename, line,
		    "File should exist: %s", fn);
		failure_finish(NULL);
		return (0);
	}
	contents = malloc(s * 2);
	n = (int)fread(contents, 1, s * 2, f);
	fclose(f);
	if (n == s && memcmp(buff, contents, s) == 0) {
		free(contents);
		return (1);
	}
	failure_start(filename, line, "File contents don't match");
	logprintf("  file=\"%s\"\n", fn);
	if (n > 0)
		hexdump(contents, buff, n > 512 ? 512 : n, 0);
	else {
		logprintf("  File empty, contents should be:\n");
		hexdump(buff, NULL, s > 512 ? 512 : s, 0);
	}
	failure_finish(NULL);
	free(contents);
	return (0);
}